

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_integers.cpp
# Opt level: O0

int main(void)

{
  longlong lVar1;
  longlong lVar2;
  longlong obf;
  longlong i;
  long value;
  
  for (value = -1000; value < 1000; value = value + 1) {
    lVar1 = obme::OBME<long_long>(value);
    lVar2 = obme::OBME<long_long>(value);
    printf("%lld: %lld \n",lVar2,lVar1);
  }
  return 1;
}

Assistant:

int main()
{
	long long i = -1000;
	for(; i < 1000; ++i) {
		long long obf = OBME(i);
		printf("%lld: %lld \n", OBME(obf), obf);
	}
	
	return 1;
}